

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::trace_api_calls(Solver *this,FILE *file)

{
  State *pSVar1;
  Solver *in_RSI;
  Solver *in_RDI;
  
  require_solver_pointer_to_be_non_zero(in_RSI,&in_RDI->adding_clause,(char *)0xe202f6);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RSI != (Solver *)0x0) {
    if ((tracing_api_calls_through_environment_variable_method & 1) != 0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "void CaDiCaL::Solver::trace_api_calls(FILE *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"already tracing API calls using environment variable \'CADICAL_API_TRACE\'");
      fputc(10,_stderr);
      fflush(_stderr);
      abort();
    }
    if (in_RDI->trace_api_file == (FILE *)0x0) {
      in_RDI->trace_api_file = (FILE *)in_RSI;
      trace_api_call(in_RSI,&in_RDI->adding_clause);
      return;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::trace_api_calls(FILE *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"called twice");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  fatal_message_start();
  fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
          "void CaDiCaL::Solver::trace_api_calls(FILE *)",
          "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
         );
  fprintf(_stderr,"invalid zero file argument");
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::trace_api_calls (FILE *file) {
  LOG_API_CALL_BEGIN ("trace_api_calls");
  REQUIRE_VALID_STATE ();
  REQUIRE (file != 0, "invalid zero file argument");
  REQUIRE (!tracing_api_calls_through_environment_variable_method,
           "already tracing API calls "
           "using environment variable 'CADICAL_API_TRACE'");
  REQUIRE (!trace_api_file, "called twice");
  trace_api_file = file;
  LOG_API_CALL_END ("trace_api_calls");
  trace_api_call ("init");
}